

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void update_weight(vw *all,float step_size)

{
  if ((all->weights).sparse == true) {
    update_weight<sparse_parameters>(all,step_size,&(all->weights).sparse_weights);
    return;
  }
  update_weight<dense_parameters>(all,step_size,&(all->weights).dense_weights);
  return;
}

Assistant:

void update_weight(vw& all, float step_size)
{
  if (all.weights.sparse)
    update_weight(all, step_size, all.weights.sparse_weights);
  else
    update_weight(all, step_size, all.weights.dense_weights);
}